

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::ReduceLayerParams::SerializeWithCachedSizes
          (ReduceLayerParams *this,CodedOutputStream *output)

{
  float value;
  
  if (this->mode_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(1,this->mode_,output);
  }
  value = this->epsilon_;
  if ((value != 0.0) || (NAN(value))) {
    google::protobuf::internal::WireFormatLite::WriteFloat(2,value,output);
  }
  if (this->axis_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(3,this->axis_,output);
    return;
  }
  return;
}

Assistant:

void ReduceLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ReduceLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.ReduceLayerParams.ReduceOperation mode = 1;
  if (this->mode() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->mode(), output);
  }

  // float epsilon = 2;
  if (this->epsilon() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(2, this->epsilon(), output);
  }

  // .CoreML.Specification.ReduceLayerParams.ReduceAxis axis = 3;
  if (this->axis() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      3, this->axis(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ReduceLayerParams)
}